

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameFinder.cpp
# Opt level: O2

void __thiscall
OpenMD::NameFinder::matchBond(NameFinder *this,string *molName,string *bondName,SelectionSet *bs)

{
  pointer psVar1;
  __shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  NameFinder *this_00;
  NameFinder *pNVar3;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  bondNodes;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  molNodes;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  bondAtomNodes;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  local_a8;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  local_90;
  __shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> local_68;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  local_58;
  __shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_68,
             &(this->root_).super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>);
  getMatchedChildren(&local_90,this,(TreeNodePtr *)&local_68,molName);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  for (p_Var2 = &(local_90.
                  super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
      p_Var2 != &(local_90.
                  super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                 super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
      p_Var2 = p_Var2 + 1) {
    std::__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_78,p_Var2);
    getMatchedChildren(&local_a8,this,(TreeNodePtr *)&local_78,bondName);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
    for (pNVar3 = (NameFinder *)
                  local_a8.
                  super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pNVar3 != (NameFinder *)
                  local_a8.
                  super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pNVar3 = (NameFinder *)
                 &(pNVar3->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      SelectionSet::orOperator
                (bs,(SelectionSet *)
                    &(pNVar3->info_->randNumGen_).
                     super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
      this_00 = pNVar3;
      std::__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,(__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)pNVar3);
      getAllChildren(&local_58,this_00,(TreeNodePtr *)&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      for (psVar1 = local_58.
                    super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar1 != local_58.
                    super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; psVar1 = psVar1 + 1) {
        SelectionSet::orOperator
                  (bs,&((psVar1->super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->bs);
      }
      std::
      vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
      ::~vector(&local_58);
    }
    std::
    vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>::
    ~vector(&local_a8);
  }
  std::
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>::
  ~vector(&local_90);
  return;
}

Assistant:

void NameFinder::matchBond(const std::string& molName,
                             const std::string& bondName, SelectionSet& bs) {
    std::vector<TreeNodePtr> molNodes = getMatchedChildren(root_, molName);
    std::vector<TreeNodePtr>::iterator i;
    for (i = molNodes.begin(); i != molNodes.end(); ++i) {
      std::vector<TreeNodePtr> bondNodes = getMatchedChildren(*i, bondName);
      std::vector<TreeNodePtr>::iterator j;
      for (j = bondNodes.begin(); j != bondNodes.end(); ++j) {
        bs |= (*j)->bs;
        std::vector<TreeNodePtr> bondAtomNodes = getAllChildren(*j);
        std::vector<TreeNodePtr>::iterator k;
        for (k = bondAtomNodes.begin(); k != bondAtomNodes.end(); ++k) {
          bs |= (*k)->bs;
        }
      }
    }
  }